

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O0

Result * CoreML::validateOptionalNN(Result *__return_storage_ptr__,ModelDescription *description)

{
  bool bVar1;
  bool bVar2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *this;
  FeatureType *this_00;
  allocator<char> local_61;
  string local_60;
  reference local_40;
  FeatureDescription *input;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  bool hasNotOptional;
  ModelDescription *description_local;
  
  bVar1 = false;
  this = Specification::ModelDescription::input(description);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (this);
  input = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(this);
  do {
    bVar2 = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                      (&__end1,(iterator *)&input);
    if (!bVar2) {
LAB_003a5a71:
      if (bVar1) {
        Result::Result(__return_storage_ptr__);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,
                   "At least one feature for a neural network must NOT be optional.",&local_61);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
      }
      return __return_storage_ptr__;
    }
    local_40 = google::protobuf::internal::
               RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                         (&__end1);
    this_00 = Specification::FeatureDescription::type(local_40);
    bVar2 = Specification::FeatureType::isoptional(this_00);
    if (!bVar2) {
      bVar1 = true;
      goto LAB_003a5a71;
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

inline Result validateOptionalNN(const Specification::ModelDescription& description) {
        // just need to check that not all inputs are optional
        bool hasNotOptional = false;
        for (const auto& input : description.input()) {
            if (!input.type().isoptional()) {
                hasNotOptional = true;
                break;
            }
        }
        if (!hasNotOptional) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "At least one feature for a neural network must NOT be optional.");
        }
        return Result();
    }